

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O2

double __thiscall ADL_JavaOPL3::Channel2op::getChannelOutput(Channel2op *this,OPL3 *OPL3)

{
  float fVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = ((this->super_Channel).feedback[0] + (this->super_Channel).feedback[1]) * 0.5;
  iVar2 = (this->super_Channel).cnt;
  if (iVar2 == 1) {
    if (((this->op1->envelopeGenerator).stage == OFF) &&
       ((this->op2->envelopeGenerator).stage == OFF)) {
      return 0.0;
    }
    dVar5 = Operator::getOperatorOutput(this->op1,OPL3,dVar3);
    dVar3 = Operator::getOperatorOutput(this->op2,OPL3,0.0);
    dVar4 = (dVar3 + dVar5) * 0.5;
  }
  else {
    dVar4 = 0.0;
    dVar5 = 0.0;
    if (iVar2 == 0) {
      if ((this->op2->envelopeGenerator).stage == OFF) {
        return 0.0;
      }
      dVar5 = Operator::getOperatorOutput(this->op1,OPL3,dVar3);
      dVar4 = Operator::getOperatorOutput(this->op2,OPL3,dVar5 * 4.0);
    }
  }
  (this->super_Channel).feedback[0] = (this->super_Channel).feedback[1];
  fVar1 = *(float *)(ChannelData::feedback + (long)(this->super_Channel).fb * 4);
  dVar3 = trunc((double)fVar1 * dVar5);
  (this->super_Channel).feedback[1] = (double)fVar1 * dVar5 - dVar3;
  return dVar4;
}

Assistant:

double Channel2op::getChannelOutput(OPL3 *OPL3) {
	double channelOutput = 0, op1Output = 0, op2Output = 0;
	// The feedback uses the last two outputs from
	// the first operator, instead of just the last one. 
	double feedbackOutput = (feedback[0] + feedback[1]) / 2;
	
	switch(cnt) {
		// CNT = 0, the operators are in series, with the first in feedback.
		case 0:
			if(op2->envelopeGenerator.stage==EnvelopeGenerator::OFF) 
				return 0;
			op1Output = op1->getOperatorOutput(OPL3, feedbackOutput);
			channelOutput = op2->getOperatorOutput(OPL3, op1Output*toPhase);
			break;
		// CNT = 1, the operators are in parallel, with the first in feedback.
		case 1:
			if(op1->envelopeGenerator.stage==EnvelopeGenerator::OFF && 
				op2->envelopeGenerator.stage==EnvelopeGenerator::OFF) 
					return 0;
			op1Output = op1->getOperatorOutput(OPL3, feedbackOutput);
			op2Output = op2->getOperatorOutput(OPL3, Operator::noModulator);
			channelOutput = (op1Output + op2Output) / 2;
	}
	
	feedback[0] = feedback[1];
	feedback[1] = StripIntPart(op1Output * ChannelData::feedback[fb]);
	return channelOutput;
}